

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URResolution.cpp
# Opt level: O2

void __thiscall
Inferences::URResolution::Item::resolveLiteral
          (Item *this,uint idx,
          QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::LiteralClause> *unif,
          Clause *premise,bool useQuerySubstitution)

{
  Color CVar1;
  Literal **ppLVar2;
  ResultSubstitution *pRVar3;
  Literal **ppLVar4;
  Literal **ppLVar5;
  long lVar6;
  bool bVar7;
  Color CVar8;
  int iVar9;
  Literal *pLVar10;
  Term *pTVar11;
  Literal *pLVar12;
  AnswerLiteralManager *pAVar13;
  undefined4 extraout_var;
  long lVar14;
  Term *pTVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  
  ppLVar2 = (this->_lits)._stack;
  pLVar12 = ppLVar2[idx];
  ppLVar2[idx] = (Literal *)0x0;
  (this->_premises)._array[idx] = premise;
  CVar1 = this->_color;
  CVar8 = Kernel::Clause::color(premise);
  this->_color = CVar8 | CVar1;
  lVar6 = 0x18;
  lVar18 = 0x30;
  if ((&this->_ansLit->super_Term != (Term *)0x0) &&
     (bVar7 = Kernel::Term::ground(&this->_ansLit->super_Term), !bVar7)) {
    pRVar3 = (unif->unifier)._obj;
    lVar14 = lVar18;
    if (useQuerySubstitution) {
      lVar14 = lVar6;
    }
    pLVar10 = (Literal *)
              (**(code **)((long)pRVar3->_vptr_ResultSubstitution + lVar14))(pRVar3,this->_ansLit);
    this->_ansLit = pLVar10;
  }
  if ((*(int *)(Lib::env + 0x8898) == 2) &&
     (bVar7 = Kernel::Clause::hasAnswerLiteral(premise), bVar7)) {
    pTVar11 = &Kernel::Clause::getAnswerLiteral(premise)->super_Term;
    bVar7 = Kernel::Term::ground(pTVar11);
    if (!bVar7) {
      pRVar3 = (unif->unifier)._obj;
      lVar14 = lVar6;
      if (useQuerySubstitution) {
        lVar14 = lVar18;
      }
      pTVar11 = (Term *)(**(code **)((long)pRVar3->_vptr_ResultSubstitution + lVar14))
                                  (pRVar3,pTVar11);
    }
    if (&this->_ansLit->super_Term != (Term *)0x0) {
      if (&this->_ansLit->super_Term == pTVar11) goto LAB_0041df3b;
      uVar17 = (pLVar12->super_Term)._args[0]._content;
      pRVar3 = (unif->unifier)._obj;
      lVar14 = lVar18;
      if (useQuerySubstitution) {
        lVar14 = lVar6;
      }
      pLVar12 = (Literal *)
                (**(code **)((long)pRVar3->_vptr_ResultSubstitution + lVar14))(pRVar3,pLVar12);
      if ((uVar17 & 4) == 0) {
        pLVar12 = Kernel::Literal::complementaryLiteral(pLVar12);
      }
      pAVar13 = Shell::AnswerLiteralManager::getInstance();
      pTVar15 = &this->_ansLit->super_Term;
      if ((uVar17 & 4) == 0) {
        pTVar15 = pTVar11;
        pTVar11 = &this->_ansLit->super_Term;
      }
      iVar9 = (*pAVar13->_vptr_AnswerLiteralManager[5])(pAVar13,pLVar12,pTVar11,pTVar15);
      pTVar11 = (Term *)CONCAT44(extraout_var,iVar9);
    }
    this->_ansLit = (Literal *)pTVar11;
  }
LAB_0041df3b:
  if (this->_atMostOneNonGround == false) {
    ppLVar2 = (this->_lits)._cursor;
    ppLVar4 = (this->_lits)._stack;
    if (useQuerySubstitution) {
      lVar18 = 0x18;
    }
    uVar16 = 0;
    for (uVar17 = 0; ((ulong)((long)ppLVar2 - (long)ppLVar4) >> 3 & 0xffffffff) != uVar17;
        uVar17 = uVar17 + 1) {
      ppLVar5 = (this->_lits)._stack;
      if (ppLVar5[uVar17] != (Literal *)0x0) {
        pTVar11 = (Term *)(**(code **)((long)((unif->unifier)._obj)->_vptr_ResultSubstitution +
                                      lVar18))();
        ppLVar5[uVar17] = (Literal *)pTVar11;
        bVar7 = Kernel::Term::ground(pTVar11);
        uVar16 = uVar16 + !bVar7;
      }
    }
    this->_atMostOneNonGround = uVar16 < 2;
  }
  return;
}

Assistant:

void resolveLiteral(unsigned idx, QueryRes<ResultSubstitutionSP, LiteralClause>& unif, Clause* premise, bool useQuerySubstitution)
  {
    Literal* rlit = _lits[idx];
    _lits[idx] = 0;
    _premises[idx] = premise;
    _color = static_cast<Color>(_color | premise->color());
    ASS_NEQ(_color, COLOR_INVALID)

    if (_ansLit && !_ansLit->ground()) {
      _ansLit = unif.unifier->apply(_ansLit, !useQuerySubstitution);
    }
    bool synthesis = (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS);
    if (synthesis && premise->hasAnswerLiteral()) {
      Literal* premAnsLit = premise->getAnswerLiteral();
      if (!premAnsLit->ground()) {
        premAnsLit = unif.unifier->apply(premAnsLit, useQuerySubstitution);
      }
      if (!_ansLit) {
        _ansLit = premAnsLit;
      } else if (_ansLit != premAnsLit) {
        bool neg = rlit->isNegative();
        Literal* resolved = unif.unifier->apply(rlit, !useQuerySubstitution);
        if (neg) {
          resolved = Literal::complementaryLiteral(resolved);
        }
        _ansLit = AnswerLiteralManager::getInstance()->makeITEAnswerLiteral(resolved, neg ? _ansLit : premAnsLit, neg ? premAnsLit : _ansLit);
      }
    }

    if(_atMostOneNonGround) {
      return;
    }

    unsigned nonGroundCnt = 0;
    unsigned clen = _lits.size();
    for(unsigned i=0; i<clen; i++) {
      Literal*& lit = _lits[i];
      if(!lit) {
        continue;
      }
      lit = unif.unifier->apply(lit, !useQuerySubstitution);
      if(!lit->ground()) {
        nonGroundCnt++;
      }
    }
    _atMostOneNonGround = nonGroundCnt<=1;
  }